

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

string * __thiscall pbrt::TriangleMesh::ToString_abi_cxx11_(TriangleMesh *this)

{
  bool *args_1;
  bool *args;
  char *fmt;
  long in_RSI;
  string *in_RDI;
  bool bVar1;
  string np;
  size_t in_stack_fffffffffffffdd8;
  Normal3<float> *in_stack_fffffffffffffde0;
  span<const_pbrt::Normal3<float>_> *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  allocator<char> *in_stack_fffffffffffffe10;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  allocator<char> *in_stack_fffffffffffffe28;
  allocator<char> *in_stack_fffffffffffffe30;
  allocator<char> local_189 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined6 in_stack_fffffffffffffea8;
  byte bVar2;
  allocator<char> in_stack_fffffffffffffeaf;
  string local_140 [38];
  byte local_11a;
  undefined1 local_119 [17];
  string local_108 [38];
  byte local_e2;
  allocator<char> local_e1;
  span<const_pbrt::Normal3<float>_> local_e0;
  string local_d0 [38];
  byte local_aa;
  allocator<char> local_a9;
  span<const_pbrt::Point3<float>_> local_a8;
  string local_98 [32];
  span<const_int> local_78;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  std::allocator<char>::~allocator(&local_31);
  args_1 = (bool *)(in_RSI + 0x38);
  args = (bool *)(in_RSI + 0x39);
  fmt = (char *)(in_RSI + 4);
  if (*(long *)(in_RSI + 8) == 0) {
    std::__cxx11::string::string(local_68,local_30);
  }
  else {
    local_78 = pstd::MakeSpan<const_int>((int *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8)
    ;
    StringPrintf<pstd::span<int_const>>
              (in_stack_fffffffffffffe08,(span<const_int> *)in_stack_fffffffffffffe00);
  }
  local_aa = 0;
  if (*(long *)(in_RSI + 0x10) == 0) {
    in_stack_fffffffffffffe30 = &local_a9;
    std::allocator<char>::allocator();
    local_aa = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  }
  else {
    local_a8 = pstd::MakeSpan<const_pbrt::Point3<float>_>
                         ((Point3<float> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    StringPrintf<pstd::span<pbrt::Point3<float>const>>
              (in_stack_fffffffffffffe08,
               (span<const_pbrt::Point3<float>_> *)in_stack_fffffffffffffe00);
  }
  local_e2 = 0;
  if (*(long *)(in_RSI + 0x18) == 0) {
    in_stack_fffffffffffffe28 = &local_e1;
    std::allocator<char>::allocator();
    local_e2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  }
  else {
    local_e0 = pstd::MakeSpan<const_pbrt::Normal3<float>_>
                         (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    StringPrintf<pstd::span<pbrt::Normal3<float>const>>
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  }
  local_11a = 0;
  if (*(long *)(in_RSI + 0x20) == 0) {
    in_stack_fffffffffffffe20 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_119;
    std::allocator<char>::allocator();
    local_11a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  }
  else {
    local_119._1_16_ =
         (undefined1  [16])
         pstd::MakeSpan<const_pbrt::Vector3<float>_>
                   ((Vector3<float> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    StringPrintf<pstd::span<pbrt::Vector3<float>const>>
              (in_stack_fffffffffffffe08,
               (span<const_pbrt::Vector3<float>_> *)in_stack_fffffffffffffe00);
  }
  bVar2 = 0;
  if (*(long *)(in_RSI + 0x28) == 0) {
    in_stack_fffffffffffffe18 = &stack0xfffffffffffffeaf;
    std::allocator<char>::allocator();
    bVar2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  }
  else {
    pstd::MakeSpan<const_pbrt::Point2<float>_>
              ((Point2<float> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    StringPrintf<pstd::span<pbrt::Point2<float>const>>
              (in_stack_fffffffffffffe08,
               (span<const_pbrt::Point2<float>_> *)in_stack_fffffffffffffe00);
  }
  bVar1 = *(long *)(in_RSI + 0x30) == 0;
  if (bVar1) {
    __a = local_189;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,__a);
  }
  else {
    join_0x00000010_0x00000000_ =
         pstd::MakeSpan<const_int>((int *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    StringPrintf<pstd::span<int_const>>
              (in_stack_fffffffffffffe08,(span<const_int> *)in_stack_fffffffffffffe00);
  }
  StringPrintf<bool_const&,bool_const&,int_const&,int_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (fmt,args,args_1,(int *)in_stack_fffffffffffffe30,(int *)in_stack_fffffffffffffe28,
             local_189._9_8_,in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffeaf,CONCAT16(bVar2,in_stack_fffffffffffffea8)));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe88);
  if (bVar1) {
    std::allocator<char>::~allocator(local_189);
  }
  std::__cxx11::string::~string(local_140);
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeaf);
  }
  std::__cxx11::string::~string(local_108);
  if ((local_11a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_119);
  }
  std::__cxx11::string::~string(local_d0);
  if ((local_e2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_e1);
  }
  std::__cxx11::string::~string(local_98);
  if ((local_aa & 1) != 0) {
    std::allocator<char>::~allocator(&local_a9);
  }
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string TriangleMesh::ToString() const {
    std::string np = "(nullptr)";
    return StringPrintf(
        "[ TriangleMesh reverseOrientation: %s transformSwapsHandedness: %s "
        "nTriangles: %d nVertices: %d vertexIndices: %s p: %s n: %s "
        "s: %s uv: %s faceIndices: %s ]",
        reverseOrientation, transformSwapsHandedness, nTriangles, nVertices,
        vertexIndices ? StringPrintf("%s", pstd::MakeSpan(vertexIndices, 3 * nTriangles))
                      : np,
        p ? StringPrintf("%s", pstd::MakeSpan(p, nVertices)) : nullptr,
        n ? StringPrintf("%s", pstd::MakeSpan(n, nVertices)) : nullptr,
        s ? StringPrintf("%s", pstd::MakeSpan(s, nVertices)) : nullptr,
        uv ? StringPrintf("%s", pstd::MakeSpan(uv, nVertices)) : nullptr,
        faceIndices ? StringPrintf("%s", pstd::MakeSpan(faceIndices, nTriangles))
                    : nullptr);
}